

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::DecodeBase58Request::DecodeBase58Request(DecodeBase58Request *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::DecodeBase58Request>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeBase58Request_00a87e38;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->data_,"");
  this->has_checksum_ = true;
  CollectFieldName();
  return;
}

Assistant:

DecodeBase58Request() {
    CollectFieldName();
  }